

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyToEndFrom
          (CordRepBtree *this,size_t begin,size_t new_length)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  long lVar3;
  
  if (begin < (this->super_CordRep).storage[1]) {
    __assert_fail("begin >= this->begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x2c1,
                  "CordRepBtree *absl::cord_internal::CordRepBtree::CopyToEndFrom(size_t, size_t) const"
                 );
  }
  if (begin <= (this->super_CordRep).storage[2]) {
    pCVar2 = CopyRaw(this,new_length);
    (pCVar2->super_CordRep).storage[1] = (uint8_t)begin;
    bVar1 = (pCVar2->super_CordRep).storage[2];
    for (lVar3 = begin << 3; (ulong)bVar1 * 8 != lVar3; lVar3 = lVar3 + 8) {
      CordRep::Ref(*(CordRep **)((long)pCVar2->edges_ + lVar3));
    }
    return pCVar2;
  }
  __assert_fail("begin <= this->end()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x2c2,
                "CordRepBtree *absl::cord_internal::CordRepBtree::CopyToEndFrom(size_t, size_t) const"
               );
}

Assistant:

size_t end() const { return static_cast<size_t>(storage[2]); }